

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O3

ostream * Omega_h::operator<<(ostream *os,Language *lang)

{
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  pointer pPVar3;
  size_t __n;
  pointer pbVar4;
  int iVar5;
  ostream *poVar6;
  const_iterator cVar7;
  __string_type *__range2;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *symb;
  pointer pbVar9;
  Production *prod_1;
  pointer pPVar10;
  Token *token;
  pointer pTVar11;
  Production *prod;
  __string_type lead;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonterminal_list;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonterminal_set;
  stringstream ss;
  long *local_248;
  size_t local_240;
  long local_238 [2];
  Language *local_228;
  pointer local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  pointer local_1f8;
  pointer local_1f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pTVar2 = (lang->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_228 = lang;
  for (pTVar11 = (lang->tokens).
                 super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
                 ._M_impl.super__Vector_impl_data._M_start; pTVar11 != pTVar2; pTVar11 = pTVar11 + 1
      ) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"token ",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pTVar11->name)._M_dataplus._M_p,(pTVar11->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," regex \'",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(pTVar11->regex)._M_dataplus._M_p,(pTVar11->regex)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
  }
  p_Var1 = &local_1e8._M_impl.super__Rb_tree_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar10 = (local_228->productions).
            super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (local_228->productions).
           super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (pPVar10 != pPVar3) {
    do {
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_1e8,&pPVar10->lhs);
      if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_1e8,&pPVar10->lhs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_218,&pPVar10->lhs);
      }
      pPVar10 = pPVar10 + 1;
    } while (pPVar10 != pPVar3);
    local_1f8 = local_218.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar9 = local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::stringstream::stringstream(local_1b8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ::=",4);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_248,local_240);
        if (local_240 != 0) {
          memset(local_248,0x20,local_240);
        }
        pPVar10 = (local_228->productions).
                  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1f0 = (local_228->productions).
                    super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (pPVar10 != local_1f0) {
          bVar8 = true;
          local_220 = pbVar9;
          do {
            __n = (pPVar10->lhs)._M_string_length;
            if ((__n == pbVar9->_M_string_length) &&
               ((__n == 0 ||
                (iVar5 = bcmp((pPVar10->lhs)._M_dataplus._M_p,(pbVar9->_M_dataplus)._M_p,__n),
                iVar5 == 0)))) {
              if (!bVar8) {
                std::__ostream_insert<char,std::char_traits<char>>(os," |\n",3);
                std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_248,local_240);
              }
              pbVar4 = (pPVar10->rhs).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar9 = (pPVar10->rhs).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar4;
                  pbVar9 = pbVar9 + 1) {
                iVar5 = std::__cxx11::string::compare((char *)pbVar9);
                if (iVar5 == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(os," \'|\'",4);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (os,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
                }
              }
              bVar8 = false;
              pbVar9 = local_220;
            }
            pPVar10 = pPVar10 + 1;
          } while (pPVar10 != local_1f0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (local_248 != local_238) {
          operator_delete(local_248,local_238[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != local_1f8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1e8);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Language const& lang) {
  for (auto& token : lang.tokens) {
    os << "token " << token.name << " regex \'" << token.regex << "\'\n";
  }
  std::set<std::string> nonterminal_set;
  std::vector<std::string> nonterminal_list;
  for (auto& prod : lang.productions) {
    if (!nonterminal_set.count(prod.lhs)) {
      nonterminal_set.insert(prod.lhs);
      nonterminal_list.push_back(prod.lhs);
    }
  }
  for (auto& nonterminal : nonterminal_list) {
    std::stringstream ss;
    ss << nonterminal << " ::=";
    auto lead = ss.str();
    os << lead;
    for (auto& c : lead) c = ' ';
    bool first = true;
    for (auto& prod : lang.productions) {
      if (prod.lhs != nonterminal) continue;
      if (first)
        first = false;
      else
        os << " |\n" << lead;
      for (auto& symb : prod.rhs) {
        if (symb == "|")
          os << " '|'";
        else
          os << " " << symb;
      }
    }
    os << "\n";
  }
  os << "\n";
  return os;
}